

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Bytes __thiscall Omega_h::mark_fan_preimage(Omega_h *this,LOs *a2b)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  uint uVar3;
  Bytes BVar4;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_e1;
  string local_e0;
  Write<signed_char> out;
  Write<signed_char> local_b0;
  type f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
    if (0 < (int)(uVar2 >> 2)) {
LAB_002b3d4f:
      std::__cxx11::string::string((string *)&local_e0,"",(allocator *)&local_80);
      Write<signed_char>::Write(&out,(int)(uVar2 >> 2) + -1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      Write<signed_char>::Write(&f.out,&out);
      Write<int>::Write(&f.a2b.write_,&a2b->write_);
      if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
        uVar3 = (uint)(out.shared_alloc_.alloc)->size;
      }
      else {
        uVar3 = (uint)((ulong)out.shared_alloc_.alloc >> 3);
      }
      std::__cxx11::string::string
                ((string *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
                 ,&local_e1);
      std::operator+(&local_80,&local_40,":");
      std::__cxx11::to_string(&local_60,0x54);
      std::operator+(&local_e0,&local_80,&local_60);
      begin_code("parallel_for",local_e0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_40);
      if (0 < (int)uVar3) {
        entering_parallel = 1;
        Write<signed_char>::Write((Write<signed_char> *)&local_e0,&f.out);
        Write<int>::Write((Write<int> *)&local_e0.field_2,&f.a2b.write_);
        entering_parallel = 0;
        for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
          *(bool *)(local_e0._M_string_length + uVar2) =
               *(int *)(local_e0.field_2._8_8_ + uVar2 * 4) !=
               *(int *)(local_e0.field_2._8_8_ + 4 + uVar2 * 4);
        }
        mark_fan_preimage(Omega_h::Read<int>)::$_0::~__0((__0 *)&local_e0);
      }
      ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
      Write<signed_char>::Write(&local_b0,&out);
      Read<signed_char>::Read((Read<signed_char> *)this,&local_b0);
      Write<signed_char>::~Write(&local_b0);
      mark_fan_preimage(Omega_h::Read<int>)::$_0::~__0((__0 *)&f);
      Write<signed_char>::~Write(&out);
      BVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
      BVar4.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Bytes)BVar4.write_.shared_alloc_;
    }
  }
  else if (0 < (int)((ulong)pAVar1 >> 5)) {
    uVar2 = (ulong)pAVar1 >> 3;
    goto LAB_002b3d4f;
  }
  fail("assertion %s failed at %s +%d\n","a2b.size() >= 1",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x11b);
}

Assistant:

Bytes mark_fan_preimage(LOs a2b) {
  OMEGA_H_CHECK(a2b.size() >= 1);
  auto out = Write<Byte>(a2b.size() - 1);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = (a2b[i] != a2b[i + 1]); };
  parallel_for(out.size(), f);
  return out;
}